

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall
TCMallocImplementation::ReleaseToSystem(TCMallocImplementation *this,size_t num_bytes)

{
  Length LVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
  LOCK();
  bVar4 = tcmalloc::Static::pageheap_._8_4_ == 0;
  if (bVar4) {
    tcmalloc::Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  }
  uVar3 = this->extra_bytes_released_;
  sVar2 = uVar3 - num_bytes;
  if (uVar3 < num_bytes) {
    uVar3 = num_bytes - uVar3;
    LVar1 = 1;
    if (0x1fff < uVar3) {
      LVar1 = uVar3 >> 0xd;
    }
    LVar1 = tcmalloc::PageHeap::ReleaseAtLeastNPages((PageHeap *)tcmalloc::Static::pageheap_,LVar1);
    sVar2 = 0;
    if (uVar3 <= LVar1 * 0x2000) {
      sVar2 = LVar1 * 0x2000 - uVar3;
    }
  }
  this->extra_bytes_released_ = sVar2;
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

virtual void ReleaseToSystem(size_t num_bytes) {
    SpinLockHolder h(Static::pageheap_lock());
    if (num_bytes <= extra_bytes_released_) {
      // We released too much on a prior call, so don't release any
      // more this time.
      extra_bytes_released_ = extra_bytes_released_ - num_bytes;
      return;
    }
    num_bytes = num_bytes - extra_bytes_released_;
    // num_bytes might be less than one page.  If we pass zero to
    // ReleaseAtLeastNPages, it won't do anything, so we release a whole
    // page now and let extra_bytes_released_ smooth it out over time.
    Length num_pages = std::max<Length>(num_bytes >> kPageShift, 1);
    size_t bytes_released = Static::pageheap()->ReleaseAtLeastNPages(
        num_pages) << kPageShift;
    if (bytes_released > num_bytes) {
      extra_bytes_released_ = bytes_released - num_bytes;
    } else {
      // The PageHeap wasn't able to release num_bytes.  Don't try to
      // compensate with a big release next time.  Specifically,
      // ReleaseFreeMemory() calls ReleaseToSystem(LONG_MAX).
      extra_bytes_released_ = 0;
    }
  }